

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosYAML.cpp
# Opt level: O1

void adios2::helper::ParseHostOptionsFile
               (Comm *comm,string *configFileYAML,HostOptions *hosts,string *homePath)

{
  string *psVar1;
  undefined1 *puVar2;
  bool bVar3;
  long *plVar4;
  undefined8 *puVar5;
  InvalidNode *pIVar6;
  size_type *psVar7;
  Node *pNVar8;
  long *plVar9;
  node **ppnVar10;
  size_type sVar11;
  value vVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  Node *pNVar14;
  _Alloc_hider _Var15;
  undefined1 mandatory;
  undefined8 uVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  string authStr;
  string hint;
  iterator itHost;
  const_iterator itDoc;
  HostConfig hc;
  Node hostentry;
  string hostname;
  string protocolStr;
  Node document;
  vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_> hostConfigs;
  string configFileContents;
  string local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  undefined1 local_678 [32];
  _Alloc_hider local_658;
  SeqIter SStack_650;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_648;
  element_type *local_638;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_630;
  _Alloc_hider local_628;
  SeqIter SStack_620;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_618;
  element_type *local_608;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_600;
  string local_5f8;
  undefined1 local_5d8 [32];
  HostAccessProtocol local_5b8;
  unsigned_short local_5b4;
  unsigned_short local_5b2;
  undefined1 local_5b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  HostAuthProtocol local_550;
  undefined4 uStack_54c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  bool local_508;
  bool local_507 [3];
  int local_504;
  undefined1 local_500 [16];
  char local_4f0 [8];
  char local_4e8 [16];
  element_type *local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4d0;
  undefined8 *local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  long *local_4a0;
  long local_498;
  long local_490;
  long lStack_488;
  long *local_480;
  long local_478;
  long local_470;
  long lStack_468;
  size_type *local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  string local_430;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_400;
  Node local_3f0;
  Node local_3b0;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<adios2::HostConfig,std::allocator<adios2::HostConfig>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<adios2::HostConfig,std::allocator<adios2::HostConfig>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<adios2::HostConfig,std::allocator<adios2::HostConfig>>>>>
  *local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  element_type *local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_338;
  undefined8 *local_330;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  undefined1 local_2a8 [32];
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  undefined1 local_208 [32];
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_> local_108;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_370 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<adios2::HostConfig,std::allocator<adios2::HostConfig>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<adios2::HostConfig,std::allocator<adios2::HostConfig>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<adios2::HostConfig,std::allocator<adios2::HostConfig>>>>>
               *)hosts;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d8,
                 "when parsing host config file ",configFileYAML);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_5d8);
  local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_6b8.field_2._M_allocated_capacity = *psVar7;
    local_6b8.field_2._8_8_ = plVar4[3];
  }
  else {
    local_6b8.field_2._M_allocated_capacity = *psVar7;
    local_6b8._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_6b8._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_5d8 + 0x10)) {
    operator_delete((void *)local_5d8._0_8_);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,local_6b8._M_dataplus._M_p,
             local_6b8._M_dataplus._M_p + local_6b8._M_string_length);
  uVar16 = 0;
  Comm::BroadcastFile(&local_50,comm,configFileYAML,&local_b0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  YAML::Load((Node *)&local_368,&local_50);
  if ((local_368._M_local_buf[0] != '\x01') ||
     ((local_330 != (undefined8 *)0x0 && (**(char **)*local_330 == '\0')))) {
    local_5d8._0_8_ = local_5d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5d8,"Helper","");
    local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"adiosHostOptions","");
    local_500._0_8_ = local_4f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_500,"ParseHostOptionsFile","");
    std::operator+(&local_450,"parser error in file ",configFileYAML);
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_450);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 == paVar13) {
      local_648._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_648._8_8_ = puVar5[3];
      local_658._M_p = (pointer)&local_648;
    }
    else {
      local_648._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_658._M_p = (pointer)*puVar5;
    }
    SStack_650._M_current = (node **)puVar5[1];
    *puVar5 = paVar13;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_658,(ulong)local_6b8._M_dataplus._M_p);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 == paVar13) {
      local_618._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_618._8_8_ = plVar4[3];
      local_628._M_p = (pointer)&local_618;
    }
    else {
      local_618._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_628._M_p = (pointer)*plVar4;
    }
    SStack_620._M_current = (node **)plVar4[1];
    *plVar4 = (long)paVar13;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    uVar16 = 0xffffffff;
    Throw<std::invalid_argument>
              ((string *)local_5d8,&local_430,(string *)local_500,(string *)&local_628,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_628._M_p != &local_618) {
      operator_delete(local_628._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_658._M_p != &local_648) {
      operator_delete(local_658._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p);
    }
    if ((char *)local_500._0_8_ != local_4f0) {
      operator_delete((void *)local_500._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_5d8 + 0x10)) {
      operator_delete((void *)local_5d8._0_8_);
    }
  }
  paVar13 = &local_368;
  bVar3 = YAML::Node::IsMap((Node *)paVar13);
  if (!bVar3) {
    local_5d8._0_8_ = local_5d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5d8,"Helper","");
    local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"adiosHostOptions","");
    local_500._0_8_ = local_4f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_500,"ParseHostOptionsFile","");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_628,
                   "parser error: not a YAML Map of hosts, ",&local_6b8);
    uVar16 = 0xffffffff;
    Throw<std::invalid_argument>
              ((string *)local_5d8,&local_430,(string *)local_500,(string *)&local_628,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_628._M_p != &local_618) {
      operator_delete(local_628._M_p);
    }
    if ((char *)local_500._0_8_ != local_4f0) {
      operator_delete((void *)local_500._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p);
    }
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5d8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_5d8 + 0x10)) {
      operator_delete((void *)local_5d8._0_8_);
    }
  }
  puVar5 = local_330;
  if (local_368._M_local_buf[0] == '\0') {
    local_628._M_p = (pointer)((ulong)local_628._M_p._4_4_ << 0x20);
    SStack_620._M_current = (node **)0x0;
    local_618._M_allocated_capacity = 0;
    local_618._8_8_ = 0;
    local_608 = (element_type *)0x0;
    local_600._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (local_330 == (undefined8 *)0x0) {
      local_628._M_p = (pointer)((ulong)local_628._M_p._4_4_ << 0x20);
      SStack_620._M_current = (node **)0x0;
      local_618._M_allocated_capacity = 0;
      local_618._8_8_ = 0;
      local_608 = (element_type *)0x0;
      local_600._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      YAML::detail::node_data::begin((node_iterator *)local_5d8,*(node_data **)*local_330);
      paVar13 = local_338;
      if (local_338 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        local_618._M_allocated_capacity = local_5d8._16_8_;
        local_618._8_8_ = local_5d8._24_8_;
        local_628._M_p = (pointer)local_5d8._0_8_;
        SStack_620._M_current = (node **)local_5d8._8_8_;
        local_608 = local_340;
        local_600._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(((string *)(local_338->_M_local_buf + 8))->_M_dataplus)._M_p =
               *(int *)&(((string *)(local_338->_M_local_buf + 8))->_M_dataplus)._M_p + 1;
          UNLOCK();
        }
        else {
          *(int *)&(((string *)(local_338->_M_local_buf + 8))->_M_dataplus)._M_p =
               *(int *)&(((string *)(local_338->_M_local_buf + 8))->_M_dataplus)._M_p + 1;
        }
        local_618._M_allocated_capacity = local_5d8._16_8_;
        local_618._8_8_ = local_5d8._24_8_;
        local_628._M_p = (pointer)local_5d8._0_8_;
        SStack_620._M_current = (node **)local_5d8._8_8_;
        local_608 = local_340;
        local_600._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338;
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(((string *)(local_338->_M_local_buf + 8))->_M_dataplus)._M_p =
               *(int *)&(((string *)(local_338->_M_local_buf + 8))->_M_dataplus)._M_p + 1;
          UNLOCK();
        }
        else {
          *(int *)&(((string *)(local_338->_M_local_buf + 8))->_M_dataplus)._M_p =
               *(int *)&(((string *)(local_338->_M_local_buf + 8))->_M_dataplus)._M_p + 1;
        }
      }
    }
    if (paVar13 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0 && puVar5 != (undefined8 *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paVar13);
    }
  }
  local_460 = &local_548._M_string_length;
  local_458 = &local_3b0.m_invalidKey.field_2;
  do {
    puVar5 = local_330;
    if (local_368._M_local_buf[0] == '\x01') {
      if (local_330 == (undefined8 *)0x0) {
        ppnVar10 = (node **)0x0;
        sVar11 = 0;
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
        vVar12 = NoneType;
      }
      else {
        YAML::detail::node_data::end((node_iterator *)local_5d8,*(node_data **)*local_330);
        ppnVar10 = (node **)local_5d8._8_8_;
        sVar11 = local_5d8._16_8_;
        paVar13 = local_338;
        vVar12 = local_5d8._0_4_;
        if (local_338 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(((string *)(local_338->_M_local_buf + 8))->_M_dataplus)._M_p =
                 *(int *)&(((string *)(local_338->_M_local_buf + 8))->_M_dataplus)._M_p + 1;
            UNLOCK();
          }
          else {
            *(int *)&(((string *)(local_338->_M_local_buf + 8))->_M_dataplus)._M_p =
                 *(int *)&(((string *)(local_338->_M_local_buf + 8))->_M_dataplus)._M_p + 1;
          }
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(((string *)(local_338->_M_local_buf + 8))->_M_dataplus)._M_p =
                 *(int *)&(((string *)(local_338->_M_local_buf + 8))->_M_dataplus)._M_p + 1;
            UNLOCK();
          }
          else {
            *(int *)&(((string *)(local_338->_M_local_buf + 8))->_M_dataplus)._M_p =
                 *(int *)&(((string *)(local_338->_M_local_buf + 8))->_M_dataplus)._M_p + 1;
          }
        }
      }
      if (paVar13 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0 && puVar5 != (undefined8 *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paVar13);
      }
    }
    else {
      vVar12 = NoneType;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
      sVar11 = 0;
      ppnVar10 = (node **)0x0;
    }
    if ((value)local_628._M_p == vVar12) {
      if ((value)local_628._M_p == Map) {
        bVar3 = local_618._M_allocated_capacity == sVar11;
      }
      else {
        bVar3 = true;
        if ((value)local_628._M_p == Sequence) {
          bVar3 = SStack_620._M_current == ppnVar10;
        }
      }
    }
    else {
      bVar3 = false;
    }
    if (paVar13 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paVar13);
    }
    if (bVar3) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_600._M_pi !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_600._M_pi);
      }
      if (local_338 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._8_8_ != &local_350) {
        operator_delete((void *)local_368._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
        operator_delete(local_6b8._M_dataplus._M_p);
      }
      return;
    }
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator->
              ((proxy *)local_5d8,(iterator_base<const_YAML::detail::iterator_value> *)&local_628);
    if (local_5b0[0x18] == '\0') {
      pIVar6 = (InvalidNode *)__cxa_allocate_exception(0x40);
      YAML::InvalidNode::InvalidNode(pIVar6,&local_590);
      __cxa_throw(pIVar6,&YAML::InvalidNode::typeinfo,YAML::BadFile::~BadFile);
    }
    local_430._M_dataplus._M_p = local_5b0 + 0x18;
    YAML::
    as_if<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
    operator()(&local_450,
               (as_if<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                *)&local_430);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_528._M_dataplus._M_p);
    }
    if ((size_type *)CONCAT44(uStack_54c,local_550) != local_460) {
      operator_delete((undefined1 *)CONCAT44(uStack_54c,local_550));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_570._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_570._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_590._M_dataplus._M_p != &local_590.field_2) {
      operator_delete(local_590._M_dataplus._M_p);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5b0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5b0._8_8_);
    }
    if ((undefined1 *)local_5d8._8_8_ != local_5d8 + 0x18) {
      operator_delete((void *)local_5d8._8_8_);
    }
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator->
              ((proxy *)local_5d8,(iterator_base<const_YAML::detail::iterator_value> *)&local_628);
    local_500[0] = local_570.field_2._M_local_buf[8];
    local_500._8_8_ = local_4e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_500 + 8),CONCAT44(uStack_54c,local_550),
               local_548._M_dataplus._M_p + CONCAT44(uStack_54c,local_550));
    local_4d8 = (element_type *)local_548.field_2._8_8_;
    local_4d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_528._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(((string *)(local_528._M_dataplus._M_p + 8))->_M_dataplus)._M_p =
             *(int *)&(((string *)(local_528._M_dataplus._M_p + 8))->_M_dataplus)._M_p + 1;
        UNLOCK();
      }
      else {
        *(int *)&(((string *)(local_528._M_dataplus._M_p + 8))->_M_dataplus)._M_p =
             *(int *)&(((string *)(local_528._M_dataplus._M_p + 8))->_M_dataplus)._M_p + 1;
      }
    }
    local_4c8 = (undefined8 *)local_528._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_528._M_dataplus._M_p);
    }
    if ((size_type *)CONCAT44(uStack_54c,local_550) != local_460) {
      operator_delete((undefined1 *)CONCAT44(uStack_54c,local_550));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_570._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_570._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_590._M_dataplus._M_p != &local_590.field_2) {
      operator_delete(local_590._M_dataplus._M_p);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5b0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5b0._8_8_);
    }
    if ((undefined1 *)local_5d8._8_8_ != local_5d8 + 0x18) {
      operator_delete((void *)local_5d8._8_8_);
    }
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_500;
    bVar3 = YAML::Node::IsMap((Node *)paVar13);
    if (!bVar3) {
      local_5d8._0_8_ = local_5d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5d8,"Helper","");
      local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"adiosHostOptions","");
      local_658._M_p = (pointer)&local_648;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_658,"ParseHostOptionsFile","");
      std::operator+(&local_698,"parser error for host ",&local_450);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_698);
      local_678._0_8_ = local_678 + 0x10;
      pNVar8 = (Node *)(plVar4 + 2);
      if ((Node *)*plVar4 == pNVar8) {
        local_678._16_8_ = *(undefined8 *)pNVar8;
        local_678._24_8_ = plVar4[3];
      }
      else {
        local_678._16_8_ = *(undefined8 *)pNVar8;
        local_678._0_8_ = (Node *)*plVar4;
      }
      local_678._8_8_ = plVar4[1];
      *plVar4 = (long)pNVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append(local_678,(ulong)local_6b8._M_dataplus._M_p);
      psVar7 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_6d8.field_2._M_allocated_capacity = *psVar7;
        local_6d8.field_2._8_8_ = plVar4[3];
        local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
      }
      else {
        local_6d8.field_2._M_allocated_capacity = *psVar7;
        local_6d8._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_6d8._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      uVar16 = 0xffffffff;
      Throw<std::invalid_argument>
                ((string *)local_5d8,&local_430,(string *)&local_658,&local_6d8,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
        operator_delete(local_6d8._M_dataplus._M_p);
      }
      if ((Node *)local_678._0_8_ != (Node *)(local_678 + 0x10)) {
        operator_delete((void *)local_678._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_698._M_dataplus._M_p != &local_698.field_2) {
        operator_delete(local_698._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_658._M_p != &local_648) {
        operator_delete(local_658._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p);
      }
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5d8._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5d8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_5d8 + 0x10)) {
        operator_delete((void *)local_5d8._0_8_);
      }
    }
    puVar5 = local_4c8;
    local_108.super__Vector_base<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.super__Vector_base<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.super__Vector_base<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((string)local_500[0] == (string)0x0) {
      local_658._M_p = (pointer)((ulong)local_658._M_p._4_4_ << 0x20);
      local_648._8_8_ = 0;
      local_638 = (element_type *)0x0;
      SStack_650._M_current = (node **)0x0;
      local_648._M_allocated_capacity = 0;
      local_630._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      if (local_4c8 == (undefined8 *)0x0) {
        local_658._M_p = (pointer)((ulong)local_658._M_p._4_4_ << 0x20);
        local_648._8_8_ = 0;
        local_638 = (element_type *)0x0;
        SStack_650._M_current = (node **)0x0;
        local_648._M_allocated_capacity = 0;
        local_630._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        YAML::detail::node_data::begin((node_iterator *)local_5d8,*(node_data **)*local_4c8);
        paVar13 = local_4d0;
        if (local_4d0 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          local_648._M_allocated_capacity = local_5d8._16_8_;
          local_648._8_8_ = local_5d8._24_8_;
          local_658._M_p = (pointer)local_5d8._0_8_;
          SStack_650._M_current = (node **)local_5d8._8_8_;
          local_638 = local_4d8;
          local_630._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d0;
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(((string *)(local_4d0->_M_local_buf + 8))->_M_dataplus)._M_p =
                 *(int *)&(((string *)(local_4d0->_M_local_buf + 8))->_M_dataplus)._M_p + 1;
            UNLOCK();
          }
          else {
            *(int *)&(((string *)(local_4d0->_M_local_buf + 8))->_M_dataplus)._M_p =
                 *(int *)&(((string *)(local_4d0->_M_local_buf + 8))->_M_dataplus)._M_p + 1;
          }
          local_648._M_allocated_capacity = local_5d8._16_8_;
          local_648._8_8_ = local_5d8._24_8_;
          local_658._M_p = (pointer)local_5d8._0_8_;
          SStack_650._M_current = (node **)local_5d8._8_8_;
          local_638 = local_4d8;
          local_630._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d0;
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(((string *)(local_4d0->_M_local_buf + 8))->_M_dataplus)._M_p =
                 *(int *)&(((string *)(local_4d0->_M_local_buf + 8))->_M_dataplus)._M_p + 1;
            UNLOCK();
          }
          else {
            *(int *)&(((string *)(local_4d0->_M_local_buf + 8))->_M_dataplus)._M_p =
                 *(int *)&(((string *)(local_4d0->_M_local_buf + 8))->_M_dataplus)._M_p + 1;
          }
        }
      }
      if (paVar13 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0 && puVar5 != (undefined8 *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paVar13);
      }
    }
    while( true ) {
      puVar5 = local_4c8;
      if ((string)local_500[0] == (string)0x1) {
        if (local_4c8 == (undefined8 *)0x0) {
          sVar11 = 0;
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
          ppnVar10 = (node **)0x0;
          vVar12 = NoneType;
        }
        else {
          YAML::detail::node_data::end((node_iterator *)local_5d8,*(node_data **)*local_4c8);
          sVar11 = local_5d8._16_8_;
          paVar13 = local_4d0;
          ppnVar10 = (node **)local_5d8._8_8_;
          vVar12 = local_5d8._0_4_;
          if (local_4d0 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&(((string *)(local_4d0->_M_local_buf + 8))->_M_dataplus)._M_p =
                   *(int *)&(((string *)(local_4d0->_M_local_buf + 8))->_M_dataplus)._M_p + 1;
              UNLOCK();
            }
            else {
              *(int *)&(((string *)(local_4d0->_M_local_buf + 8))->_M_dataplus)._M_p =
                   *(int *)&(((string *)(local_4d0->_M_local_buf + 8))->_M_dataplus)._M_p + 1;
            }
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&(((string *)(local_4d0->_M_local_buf + 8))->_M_dataplus)._M_p =
                   *(int *)&(((string *)(local_4d0->_M_local_buf + 8))->_M_dataplus)._M_p + 1;
              UNLOCK();
            }
            else {
              *(int *)&(((string *)(local_4d0->_M_local_buf + 8))->_M_dataplus)._M_p =
                   *(int *)&(((string *)(local_4d0->_M_local_buf + 8))->_M_dataplus)._M_p + 1;
            }
          }
        }
        if (paVar13 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0 && puVar5 != (undefined8 *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paVar13);
        }
      }
      else {
        vVar12 = NoneType;
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
        sVar11 = 0;
        ppnVar10 = (node **)0x0;
      }
      paVar17 = &local_430.field_2;
      if ((value)local_658._M_p == vVar12) {
        if ((value)local_658._M_p == Map) {
          bVar3 = local_648._M_allocated_capacity == sVar11;
        }
        else {
          bVar3 = true;
          if ((value)local_658._M_p == Sequence) {
            bVar3 = SStack_650._M_current == ppnVar10;
          }
        }
      }
      else {
        bVar3 = false;
      }
      if (paVar13 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paVar13);
      }
      mandatory = (undefined1)uVar16;
      pNVar8 = (Node *)(local_678 + 0x10);
      if (bVar3) break;
      HostConfig::HostConfig((HostConfig *)local_5d8);
      YAML::detail::iterator_base<YAML::detail::iterator_value>::operator->
                ((proxy *)&local_430,(iterator_base<YAML::detail::iterator_value> *)&local_658);
      if (local_3f0.m_isValid == false) {
        pIVar6 = (InvalidNode *)__cxa_allocate_exception(0x40);
        YAML::InvalidNode::InvalidNode(pIVar6,&local_3f0.m_invalidKey);
        __cxa_throw(pIVar6,&YAML::InvalidNode::typeinfo,YAML::BadFile::~BadFile);
      }
      local_678._0_8_ = &local_3f0;
      YAML::
      as_if<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
      operator()(&local_6d8,
                 (as_if<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                  *)local_678);
      std::__cxx11::string::operator=((string *)local_5d8,(string *)&local_6d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
        operator_delete(local_6d8._M_dataplus._M_p);
      }
      if (local_3b0.m_pMemory.
          super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_3b0.m_pMemory.
                   super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0.m_invalidKey._M_dataplus._M_p != local_458) {
        operator_delete(local_3b0.m_invalidKey._M_dataplus._M_p);
      }
      if (local_3f0.m_pMemory.
          super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_3f0.m_pMemory.
                   super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0.m_invalidKey._M_dataplus._M_p != &local_3f0.m_invalidKey.field_2) {
        operator_delete(local_3f0.m_invalidKey._M_dataplus._M_p);
      }
      if (local_400 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_400);
      }
      if ((undefined1 *)local_430._M_string_length != (undefined1 *)((long)&local_430.field_2 + 8))
      {
        operator_delete((void *)local_430._M_string_length);
      }
      YAML::detail::iterator_base<YAML::detail::iterator_value>::operator->
                ((proxy *)&local_430,(iterator_base<YAML::detail::iterator_value> *)&local_658);
      if (local_3b0.m_pMemory.
          super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_3b0.m_pMemory.
                   super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0.m_invalidKey._M_dataplus._M_p != local_458) {
        operator_delete(local_3b0.m_invalidKey._M_dataplus._M_p);
      }
      if (local_3f0.m_pMemory.
          super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_3f0.m_pMemory.
                   super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0.m_invalidKey._M_dataplus._M_p != &local_3f0.m_invalidKey.field_2) {
        operator_delete(local_3f0.m_invalidKey._M_dataplus._M_p);
      }
      if (local_400 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_400);
      }
      if ((undefined1 *)local_430._M_string_length != (undefined1 *)((long)&local_430.field_2 + 8))
      {
        operator_delete((void *)local_430._M_string_length);
      }
      bVar3 = YAML::Node::IsMap(&local_3b0);
      if (!bVar3) {
        local_430._M_dataplus._M_p = (pointer)paVar17;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"Helper","");
        local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d8,"adiosHostOptions","");
        local_678._0_8_ = pNVar8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_678,"ParseHostOptionsFile","");
        std::operator+(&local_4c0,"parser error for host ",&local_450);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_4c0);
        local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
        psVar7 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_5f8.field_2._M_allocated_capacity = *psVar7;
          local_5f8.field_2._8_8_ = plVar4[3];
        }
        else {
          local_5f8.field_2._M_allocated_capacity = *psVar7;
          local_5f8._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_5f8._M_string_length = plVar4[1];
        *plVar4 = (long)psVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_5f8,(ulong)local_6b8._M_dataplus._M_p);
        local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
        psVar7 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_698.field_2._M_allocated_capacity = *psVar7;
          local_698.field_2._8_8_ = plVar4[3];
        }
        else {
          local_698.field_2._M_allocated_capacity = *psVar7;
          local_698._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_698._M_string_length = plVar4[1];
        *plVar4 = (long)psVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        mandatory = 0xff;
        Throw<std::invalid_argument>(&local_430,&local_6d8,(string *)local_678,&local_698,-1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_698._M_dataplus._M_p != &local_698.field_2) {
          operator_delete(local_698._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
          operator_delete(local_5f8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
          operator_delete(local_4c0._M_dataplus._M_p);
        }
        if ((Node *)local_678._0_8_ != pNVar8) {
          operator_delete((void *)local_678._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
          operator_delete(local_6d8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_430._M_dataplus._M_p != paVar17) {
          operator_delete(local_430._M_dataplus._M_p);
        }
      }
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"verbose","");
      anon_unknown_0::SetOption<int>(&local_504,&local_128,&local_3b0,&local_6b8,(bool)mandatory);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      local_430._M_string_length = 0;
      local_430.field_2._M_local_buf[0] = '\0';
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      local_430._M_dataplus._M_p = (pointer)paVar17;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"protocol","");
      (anonymous_namespace)::SetOption<std::__cxx11::string>
                (&local_430,&local_148,&local_3b0,&local_6b8,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
      }
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_430._M_dataplus._M_p,
                 (undefined1 *)(local_430._M_string_length + (long)local_430._M_dataplus._M_p));
      local_5b8 = GetHostAccessProtocol(&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if (local_5b8 == SSH) {
        local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
        local_6d8._M_string_length = 0;
        local_6d8.field_2._M_allocated_capacity =
             (ulong)(uint7)local_6d8.field_2._M_allocated_capacity._1_7_ << 8;
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"authentication","");
        (anonymous_namespace)::SetOption<std::__cxx11::string>
                  (&local_6d8,&local_168,&local_3b0,&local_6b8,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p);
        }
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,local_6d8._M_dataplus._M_p,
                   local_6d8._M_dataplus._M_p + local_6d8._M_string_length);
        local_550 = GetHostAuthProtocol(&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"host","");
        (anonymous_namespace)::SetOption<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_5d8 + 0x28),&local_188,&local_3b0,&local_6b8,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p);
        }
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"user","");
        (anonymous_namespace)::SetOption<std::__cxx11::string>
                  (&local_590,&local_1a8,&local_3b0,&local_6b8,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p);
        }
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"serverpath","");
        uVar16 = 1;
        (anonymous_namespace)::SetOption<std::__cxx11::string>
                  (&local_570,&local_1c8,&local_3b0,&local_6b8,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p);
        }
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"port","");
        anon_unknown_0::SetOption<unsigned_short>
                  ((unsigned_short *)(local_5d8 + 0x24),&local_1e8,&local_3b0,&local_6b8,
                   SUB81(uVar16,0));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p);
        }
        local_208._0_8_ = local_208 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"local_port","");
        anon_unknown_0::SetOption<unsigned_short>
                  ((unsigned_short *)(local_5d8 + 0x26),(string *)local_208,&local_3b0,&local_6b8,
                   SUB81(uVar16,0));
        puVar2 = local_208;
        pNVar14 = (Node *)local_208._0_8_;
LAB_004251d7:
        if (pNVar14 != (Node *)(puVar2 + 0x10)) {
LAB_004251dc:
          operator_delete(pNVar14);
        }
LAB_004251e1:
        psVar1 = &local_6d8;
        _Var15._M_p = local_6d8._M_dataplus._M_p;
      }
      else {
        if (local_5b8 == XRootD) {
          local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
          local_6d8._M_string_length = 0;
          local_6d8.field_2._M_allocated_capacity =
               (ulong)(uint7)local_6d8.field_2._M_allocated_capacity._1_7_ << 8;
          local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"authentication","");
          (anonymous_namespace)::SetOption<std::__cxx11::string>
                    (&local_6d8,&local_228,&local_3b0,&local_6b8,true);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p);
          }
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,local_6d8._M_dataplus._M_p,
                     local_6d8._M_dataplus._M_p + local_6d8._M_string_length);
          local_550 = GetHostAuthProtocol(&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"host","");
          (anonymous_namespace)::SetOption<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_5d8 + 0x28),&local_248,&local_3b0,&local_6b8,true);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2) {
            operator_delete(local_248._M_dataplus._M_p);
          }
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"user","");
          (anonymous_namespace)::SetOption<std::__cxx11::string>
                    (&local_590,&local_268,&local_3b0,&local_6b8,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p);
          }
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"serverpath","");
          uVar16 = 0;
          (anonymous_namespace)::SetOption<std::__cxx11::string>
                    (&local_570,&local_288,&local_3b0,&local_6b8,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p);
          }
          local_2a8._0_8_ = local_2a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"port","");
          anon_unknown_0::SetOption<unsigned_short>
                    ((unsigned_short *)(local_5d8 + 0x24),(string *)local_2a8,&local_3b0,&local_6b8,
                     SUB81(uVar16,0));
          puVar2 = local_2a8;
          pNVar14 = (Node *)local_2a8._0_8_;
          goto LAB_004251d7;
        }
        if (local_5b8 != S3) {
          local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d8,"Helper","");
          local_678._0_8_ = pNVar8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_678,"adiosHostOptions","")
          ;
          local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_698,"ParseHostOptionsFile","");
          std::operator+(&local_d0,"parser error: invalid access host protocol \'",&local_430);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
          local_4a0 = &local_490;
          plVar9 = plVar4 + 2;
          if ((long *)*plVar4 == plVar9) {
            local_490 = *plVar9;
            lStack_488 = plVar4[3];
          }
          else {
            local_490 = *plVar9;
            local_4a0 = (long *)*plVar4;
          }
          local_498 = plVar4[1];
          *plVar4 = (long)plVar9;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_4a0,local_5d8._0_8_);
          local_480 = &local_470;
          plVar9 = plVar4 + 2;
          if ((long *)*plVar4 == plVar9) {
            local_470 = *plVar9;
            lStack_468 = plVar4[3];
          }
          else {
            local_470 = *plVar9;
            local_480 = (long *)*plVar4;
          }
          local_478 = plVar4[1];
          *plVar4 = (long)plVar9;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_480);
          local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
          psVar7 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_4c0.field_2._M_allocated_capacity = *psVar7;
            local_4c0.field_2._8_8_ = plVar4[3];
          }
          else {
            local_4c0.field_2._M_allocated_capacity = *psVar7;
            local_4c0._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_4c0._M_string_length = plVar4[1];
          *plVar4 = (long)psVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_4c0,(ulong)local_6b8._M_dataplus._M_p);
          local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
          psVar7 = puVar5 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_5f8.field_2._M_allocated_capacity = *psVar7;
            local_5f8.field_2._8_8_ = puVar5[3];
          }
          else {
            local_5f8.field_2._M_allocated_capacity = *psVar7;
            local_5f8._M_dataplus._M_p = (pointer)*puVar5;
          }
          local_5f8._M_string_length = puVar5[1];
          *puVar5 = psVar7;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          uVar16 = 0xffffffff;
          Throw<std::invalid_argument>(&local_6d8,(string *)local_678,&local_698,&local_5f8,-1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
            operator_delete(local_5f8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
            operator_delete(local_4c0._M_dataplus._M_p);
          }
          if (local_480 != &local_470) {
            operator_delete(local_480);
          }
          if (local_4a0 != &local_490) {
            operator_delete(local_4a0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_698._M_dataplus._M_p != &local_698.field_2) {
            operator_delete(local_698._M_dataplus._M_p);
          }
          pNVar14 = (Node *)local_678._0_8_;
          if ((Node *)local_678._0_8_ != pNVar8) goto LAB_004251dc;
          goto LAB_004251e1;
        }
        local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"profile","");
        (anonymous_namespace)::SetOption<std::__cxx11::string>
                  (&local_528,&local_2c8,&local_3b0,&local_6b8,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          operator_delete(local_2c8._M_dataplus._M_p);
        }
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"endpoint","");
        uVar16 = 1;
        (anonymous_namespace)::SetOption<std::__cxx11::string>
                  (&local_548,&local_2e8,&local_3b0,&local_6b8,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p);
        }
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"aws_ec2_metadata","");
        anon_unknown_0::SetOption<bool>(&local_508,&local_308,&local_3b0,&local_6b8,SUB81(uVar16,0))
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p);
        }
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"recheck_metadata","");
        anon_unknown_0::SetOption<bool>(local_507,&local_328,&local_3b0,&local_6b8,SUB81(uVar16,0));
        psVar1 = &local_328;
        _Var15._M_p = local_328._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var15._M_p != &psVar1->field_2) {
        operator_delete(_Var15._M_p);
      }
      std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>::push_back
                (&local_108,(HostConfig *)local_5d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != paVar17) {
        operator_delete(local_430._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_528._M_dataplus._M_p != &local_528.field_2) {
        operator_delete(local_528._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_548._M_dataplus._M_p != &local_548.field_2) {
        operator_delete(local_548._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_570._M_dataplus._M_p != &local_570.field_2) {
        operator_delete(local_570._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_590._M_dataplus._M_p != &local_590.field_2) {
        operator_delete(local_590._M_dataplus._M_p);
      }
      if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
        operator_delete((void *)local_5b0._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5d8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_5d8 + 0x10)) {
        operator_delete((void *)local_5d8._0_8_);
      }
      YAML::detail::node_iterator_base<YAML::detail::node>::operator++
                ((node_iterator_base<YAML::detail::node> *)&local_658);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_630._M_pi !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_630._M_pi);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<adios2::HostConfig,std::allocator<adios2::HostConfig>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<adios2::HostConfig,std::allocator<adios2::HostConfig>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<adios2::HostConfig,std::allocator<adios2::HostConfig>>>>>
    ::
    _M_emplace_unique<std::__cxx11::string&,std::vector<adios2::HostConfig,std::allocator<adios2::HostConfig>>&>
              (local_370,&local_450,&local_108);
    std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>::~vector(&local_108);
    if (local_4d0 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4d0);
    }
    if ((char *)local_500._8_8_ != local_4e8) {
      operator_delete((void *)local_500._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p);
    }
    YAML::detail::node_iterator_base<YAML::detail::node>::operator++
              ((node_iterator_base<YAML::detail::node> *)&local_628);
  } while( true );
}

Assistant:

void ParseHostOptionsFile(Comm &comm, const std::string &configFileYAML, HostOptions &hosts,
                          std::string &homePath)
{
    const std::string hint =
        "when parsing host config file " + configFileYAML + " in call to ADIOS constructor";

    const std::string configFileContents = comm.BroadcastFile(configFileYAML, hint);

    const YAML::Node document = YAML::Load(configFileContents);
    if (!document)
    {
        helper::Throw<std::invalid_argument>(
            "Helper", "adiosHostOptions", "ParseHostOptionsFile",
            "parser error in file " + configFileYAML +
                ": invalid format. Check with any YAML editor if format is ill-formed, " + hint);
    }

    if (!document.IsMap())
    {
        helper::Throw<std::invalid_argument>("Helper", "adiosHostOptions", "ParseHostOptionsFile",
                                             "parser error: not a YAML Map of hosts, " + hint);
    }

    /* top level is a dictionary of <hostname, dictionary of options> */
    for (auto itDoc = document.begin(); itDoc != document.end(); ++itDoc)
    {
        std::string hostname = itDoc->first.as<std::string>();

        /* a dictionary of host options, with each entry a dictionary */
        YAML::Node hostentry = itDoc->second;
        if (!hostentry.IsMap())
        {
            helper::Throw<std::invalid_argument>(
                "Helper", "adiosHostOptions", "ParseHostOptionsFile",
                "parser error for host " + hostname +
                    ": each host must have a YAML Map of options, " + hint);
        }

        std::vector<HostConfig> hostConfigs;
        for (auto itHost = hostentry.begin(); itHost != hostentry.end(); ++itHost)
        {
            /* one connection setup as a dictionary */
            HostConfig hc;
            hc.name = itHost->first.as<std::string>();
            const YAML::Node &hostmap = itHost->second;
            if (!hostmap.IsMap())
            {
                helper::Throw<std::invalid_argument>(
                    "Helper", "adiosHostOptions", "ParseHostOptionsFile",
                    "parser error for host " + hostname +
                        ": each entry in the list must be a YAML Map, " + hint);
            }

            SetOption(hc.verbose, "verbose", hostmap, hint);
            std::string protocolStr;
            SetOption(protocolStr, "protocol", hostmap, hint, isMandatory);
            hc.protocol = GetHostAccessProtocol(protocolStr);
            switch (hc.protocol)
            {
            case HostAccessProtocol::SSH: {
                std::string authStr;
                SetOption(authStr, "authentication", hostmap, hint, isMandatory);
                hc.authentication = GetHostAuthProtocol(authStr);
                SetOption(hc.hostname, "host", hostmap, hint, isMandatory);
                SetOption(hc.username, "user", hostmap, hint);
                SetOption(hc.remoteServerPath, "serverpath", hostmap, hint, isMandatory);
                SetOption(hc.port, "port", hostmap, hint);
                SetOption(hc.localPort, "local_port", hostmap, hint);
                break;
            }
            case HostAccessProtocol::XRootD: {
                std::string authStr;
                SetOption(authStr, "authentication", hostmap, hint, isMandatory);
                hc.authentication = GetHostAuthProtocol(authStr);
                SetOption(hc.hostname, "host", hostmap, hint, isMandatory);
                SetOption(hc.username, "user", hostmap, hint);
                SetOption(hc.remoteServerPath, "serverpath", hostmap, hint);
                SetOption(hc.port, "port", hostmap, hint);
                break;
            }
            case HostAccessProtocol::S3: {
                SetOption(hc.awsProfile, "profile", hostmap, hint);
                SetOption(hc.endpoint, "endpoint", hostmap, hint, isMandatory);
                SetOption(hc.isAWS_EC2, "aws_ec2_metadata", hostmap, hint);
                SetOption(hc.recheckMetadata, "recheck_metadata", hostmap, hint);
                break;
            }
            default:
                helper::Throw<std::invalid_argument>(
                    "Helper", "adiosHostOptions", "ParseHostOptionsFile",
                    "parser error: invalid access host protocol '" + protocolStr + " for " +
                        hc.name + "', " + hint);
            }

            hostConfigs.push_back(hc);
        }
        hosts.emplace(hostname, hostConfigs);
    }
}